

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew,int fVerbose)

{
  long *plVar1;
  Gia_Man_t *p;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  Vec_Ptr_t *vBuffers;
  Vec_Ptr_t *local_20;
  
  p = Abc_NtkFlattenHierarchyGia(pNtk,&local_20,fVerbose);
  iVar3 = p->vCis->nSize - p->nRegs;
  if (iVar3 != pNtk->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x21f,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (iVar3 != pNew->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x220,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar3 = p->vCos->nSize - p->nRegs;
  if (iVar3 != pNtk->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x221,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (iVar3 != pNew->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x222,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (p->nBufs != local_20->nSize) {
    __assert_fail("Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x223,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (p->nBufs != pNew->nBarBufs2) {
    __assert_fail("Gia_ManBufNum(pGia) == pNew->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x224,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  Gia_ManStop(p);
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    Abc_NtkCleanCopy(pNtk);
  }
  else {
    pVVar2 = pNtk->pDesign->vModules;
    if (0 < pVVar2->nSize) {
      lVar6 = 0;
      do {
        Abc_NtkCleanCopy((Abc_Ntk_t *)pVVar2->pArray[lVar6]);
        lVar6 = lVar6 + 1;
        pVVar2 = pNtk->pDesign->vModules;
      } while (lVar6 < pVVar2->nSize);
    }
  }
  pVVar2 = pNew->vPis;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      if (pNtk->vPis->nSize <= lVar6) goto LAB_0084e8ce;
      *(void **)((long)pNtk->vPis->pArray[lVar6] + 0x40) = pVVar2->pArray[lVar6];
      lVar6 = lVar6 + 1;
      pVVar2 = pNew->vPis;
    } while (lVar6 < pVVar2->nSize);
  }
  pVVar2 = pNew->vPos;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      if (pNtk->vPos->nSize <= lVar6) goto LAB_0084e8ce;
      *(void **)((long)pNtk->vPos->pArray[lVar6] + 0x40) = pVVar2->pArray[lVar6];
      lVar6 = lVar6 + 1;
      pVVar2 = pNew->vPos;
    } while (lVar6 < pVVar2->nSize);
  }
  pVVar2 = pNew->vObjs;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      plVar1 = (long *)pVVar2->pArray[lVar6];
      if ((((plVar1 != (long *)0x0) && (*(int *)(*plVar1 + 4) == 4)) &&
          ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
         ((*(int *)((long)plVar1 + 0x1c) == 1 && (plVar1[7] == 0)))) {
        if (((int)uVar4 < 0) || (local_20->nSize <= (int)uVar4)) {
LAB_0084e8ce:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *(long **)((long)local_20->pArray[uVar5] + 0x40) = plVar1;
      }
      lVar6 = lVar6 + 1;
      pVVar2 = pNew->vObjs;
    } while (lVar6 < pVVar2->nSize);
  }
  if (local_20->pArray != (void **)0x0) {
    free(local_20->pArray);
    local_20->pArray = (void **)0x0;
  }
  if (local_20 != (Vec_Ptr_t *)0x0) {
    free(local_20);
  }
  Abc_NtkCleanCopy(pNew);
  Gia_ManInsertOne(pNtk,pNew);
  if ((pNtk->pDesign != (Abc_Des_t *)0x0) && (pVVar2 = pNtk->pDesign->vModules, 0 < pVVar2->nSize))
  {
    lVar6 = 0;
    do {
      if ((Abc_Ntk_t *)pVVar2->pArray[lVar6] != pNtk) {
        Gia_ManInsertOne((Abc_Ntk_t *)pVVar2->pArray[lVar6],pNew);
      }
      lVar6 = lVar6 + 1;
      pVVar2 = pNtk->pDesign->vModules;
    } while (lVar6 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_NtkInsertHierarchyGia( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew, int fVerbose )
{
    Vec_Ptr_t * vBuffers;
    Gia_Man_t * pGia = Abc_NtkFlattenHierarchyGia( pNtk, &vBuffers, 0 );
    Abc_Ntk_t * pModel;  
    Abc_Obj_t * pObj; 
    int i, k = 0;

    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk) );
    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew) );
    assert( Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers) );
    assert( Gia_ManBufNum(pGia) == pNew->nBarBufs2 );
    Gia_ManStop( pGia );

    // clean the networks
    if ( !pNtk->pDesign )
        Abc_NtkCleanCopy( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Abc_NtkCleanCopy( pModel );

    // annotate PIs and POs of each network with barbufs
    Abc_NtkForEachPi( pNew, pObj, i )
        Abc_NtkPi(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachPo( pNew, pObj, i )
        Abc_NtkPo(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachBarBuf( pNew, pObj, i )
        ((Abc_Obj_t *)Vec_PtrEntry(vBuffers, k++))->pCopy = pObj;
    Vec_PtrFree( vBuffers );

    // connect each model
    Abc_NtkCleanCopy( pNew );
    Gia_ManInsertOne( pNtk, pNew );
    if ( pNtk->pDesign )
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            if ( pModel != pNtk )
                Gia_ManInsertOne( pModel, pNew );
}